

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O2

bool Js::ASMLink::CheckMathLibraryMethod
               (ScriptContext *scriptContext,Var asmMathObject,
               AsmJSMathBuiltinFunction mathLibMethod)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 *funcInfo;
  double value;
  PropertyId PStack_20;
  
  switch(mathLibMethod) {
  case AsmJSMathBuiltin_sin:
    funcInfo = Math::EntryInfo::Sin;
    PStack_20 = 0x2f;
    break;
  case AsmJSMathBuiltin_cos:
    funcInfo = Math::EntryInfo::Cos;
    PStack_20 = 0x24;
    break;
  case AsmJSMathBuiltin_tan:
    funcInfo = Math::EntryInfo::Tan;
    PStack_20 = 0x31;
    break;
  case AsmJSMathBuiltin_asin:
    funcInfo = Math::EntryInfo::Asin;
    PStack_20 = 0x20;
    break;
  case AsmJSMathBuiltin_acos:
    funcInfo = Math::EntryInfo::Acos;
    PStack_20 = 0x1e;
    break;
  case AsmJSMathBuiltin_atan:
    funcInfo = Math::EntryInfo::Atan;
    PStack_20 = 0x21;
    break;
  case AsmJSMathBuiltin_ceil:
    funcInfo = Math::EntryInfo::Ceil;
    PStack_20 = 0x23;
    break;
  case AsmJSMathBuiltin_floor:
    funcInfo = Math::EntryInfo::Floor;
    PStack_20 = 0x26;
    break;
  case AsmJSMathBuiltin_exp:
    funcInfo = Math::EntryInfo::Exp;
    PStack_20 = 0x25;
    break;
  case AsmJSMathBuiltin_log:
    funcInfo = Math::EntryInfo::Log;
    PStack_20 = 0x27;
    break;
  case AsmJSMathBuiltin_pow:
    funcInfo = Math::EntryInfo::Pow;
    PStack_20 = 0x2c;
    break;
  case AsmJSMathBuiltin_sqrt:
    funcInfo = Math::EntryInfo::Sqrt;
    PStack_20 = 0x30;
    break;
  case AsmJSMathBuiltin_abs:
    funcInfo = Math::EntryInfo::Abs;
    PStack_20 = 0x1d;
    break;
  case AsmJSMathBuiltin_atan2:
    funcInfo = Math::EntryInfo::Atan2;
    PStack_20 = 0x22;
    break;
  case AsmJSMathBuiltin_imul:
    funcInfo = Math::EntryInfo::Imul;
    PStack_20 = 0x40;
    break;
  case AsmJSMathBuiltin_fround:
    funcInfo = Math::EntryInfo::Fround;
    PStack_20 = 0x42;
    break;
  case AsmJSMathBuiltin_min:
    funcInfo = Math::EntryInfo::Min;
    PStack_20 = 0x2a;
    break;
  case AsmJSMathBuiltin_max:
    funcInfo = Math::EntryInfo::Max;
    PStack_20 = 0xfe;
    break;
  case AsmJSMathBuiltin_clz32:
    funcInfo = Math::EntryInfo::Clz32;
    PStack_20 = 0x41;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                ,0xa3,"((0))","(0)");
    if (bVar2) {
      *puVar3 = 0;
      return false;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case AsmJSMathBuiltin_e:
    value = 2.718281828459045;
    PStack_20 = 0x75;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_ln10:
    value = 2.302585092994046;
    PStack_20 = 0xd3;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_ln2:
    value = 0.6931471805599453;
    PStack_20 = 0xd4;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_log2e:
    value = 1.4426950408889634;
    PStack_20 = 0x29;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_log10e:
    value = 0.4342944819032518;
    PStack_20 = 0x28;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_pi:
    value = 3.141592653589793;
    PStack_20 = 0x2b;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_sqrt1_2:
    value = 0.7071067811865476;
    PStack_20 = 0x157;
    goto LAB_0086fe46;
  case AsmJSMathBuiltin_sqrt2:
    value = 1.4142135623730951;
    PStack_20 = 0x158;
LAB_0086fe46:
    bVar2 = CheckIsBuiltinValue(scriptContext,asmMathObject,PStack_20,value);
    return bVar2;
  }
  bVar2 = CheckIsBuiltinFunction(scriptContext,asmMathObject,PStack_20,(FunctionInfo *)funcInfo);
  return bVar2;
}

Assistant:

bool ASMLink::CheckMathLibraryMethod(ScriptContext* scriptContext, const Var asmMathObject, const AsmJSMathBuiltinFunction mathLibMethod)
    {
        switch (mathLibMethod)
        {
#define ASMJS_MATH_FUNC_NAMES(name, propertyName, funcInfo) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinFunction(scriptContext, asmMathObject, PropertyIds::##propertyName, funcInfo);
#include "AsmJsBuiltInNames.h"
#define ASMJS_MATH_DOUBLE_CONST_NAMES(name, propertyName, value) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinValue(scriptContext, asmMathObject, PropertyIds::##propertyName, value);
#include "AsmJsBuiltInNames.h"
        default:
            Assume(UNREACHED);
        }
        return false;
    }